

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall bssl::anon_unknown_0::SSLTest_SetBIO_Test::TestBody(SSLTest_SetBIO_Test *this)

{
  SSL_METHOD *meth;
  BIO_METHOD *pBVar1;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<BIO> bio1;
  UniquePtr<SSL> ssl;
  AssertionResult gtest_ar_;
  UniquePtr<BIO> bio3;
  UniquePtr<BIO> bio2;
  UniquePtr<SSL_CTX> ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  _Head_base<0UL,_bio_st_*,_false> local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  AssertHelper local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_bio_st_*,_false> local_48;
  _Head_base<0UL,_bio_st_*,_false> local_40;
  string local_38;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_18;
  
  meth = (SSL_METHOD *)TLS_method();
  local_18._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  local_58[0] = (internal)
                ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
                 local_18._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      local_18._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)0x3442d9,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xd6b,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((SSL *)local_68._M_head_impl != (SSL *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    goto LAB_00181aae;
  }
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       SSL_new((SSL_CTX *)
               local_18._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  pBVar1 = BIO_s_mem();
  local_70._M_head_impl = (bio_st *)BIO_new(pBVar1);
  pBVar1 = BIO_s_mem();
  local_40._M_head_impl = (bio_st *)BIO_new(pBVar1);
  pBVar1 = BIO_s_mem();
  local_48._M_head_impl = (bio_st *)BIO_new(pBVar1);
  local_58[0] = (internal)((SSL *)local_68._M_head_impl != (SSL *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((SSL *)local_68._M_head_impl == (SSL *)0x0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)0x350267,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xd70,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
LAB_00181a40:
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  else {
    local_58[0] = (internal)((BIO *)local_70._M_head_impl != (BIO *)0x0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIO *)local_70._M_head_impl == (BIO *)0x0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_38,local_58,(AssertionResult *)"bio1","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xd71,local_38._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
      goto LAB_00181a40;
    }
    local_58[0] = (internal)((BIO *)local_40._M_head_impl != (BIO *)0x0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIO *)local_40._M_head_impl == (BIO *)0x0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_38,local_58,(AssertionResult *)"bio2","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xd72,local_38._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
      goto LAB_00181a40;
    }
    local_58[0] = (internal)((BIO *)local_48._M_head_impl != (BIO *)0x0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIO *)local_48._M_head_impl == (BIO *)0x0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_38,local_58,(AssertionResult *)"bio3","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xd73,local_38._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
      goto LAB_00181a40;
    }
    BIO_up_ref(local_70._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_70._M_head_impl,
                (BIO *)local_70._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_70._M_head_impl,
                (BIO *)local_70._M_head_impl);
    BIO_up_ref(local_40._M_head_impl);
    BIO_up_ref(local_48._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_40._M_head_impl,
                (BIO *)local_48._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_40._M_head_impl,
                (BIO *)local_48._M_head_impl);
    BIO_up_ref(local_70._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_40._M_head_impl,
                (BIO *)local_70._M_head_impl);
    BIO_up_ref(local_48._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_48._M_head_impl,
                (BIO *)local_70._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_48._M_head_impl,
                (BIO *)local_48._M_head_impl);
    BIO_up_ref(local_70._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_48._M_head_impl,
                (BIO *)local_70._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_70._M_head_impl,
                (BIO *)local_70._M_head_impl);
    BIO_up_ref(local_70._M_head_impl);
    BIO_up_ref(local_40._M_head_impl);
    SSL_set_bio((SSL *)local_68._M_head_impl,(BIO *)local_40._M_head_impl,
                (BIO *)local_70._M_head_impl);
  }
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_48);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_40);
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_70);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_68);
LAB_00181aae:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST(SSLTest, SetBIO) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  bssl::UniquePtr<BIO> bio1(BIO_new(BIO_s_mem())), bio2(BIO_new(BIO_s_mem())),
      bio3(BIO_new(BIO_s_mem()));
  ASSERT_TRUE(ssl);
  ASSERT_TRUE(bio1);
  ASSERT_TRUE(bio2);
  ASSERT_TRUE(bio3);

  // SSL_set_bio takes one reference when the parameters are the same.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // Repeating the call does nothing.
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // It takes one reference each when the parameters are different.
  BIO_up_ref(bio2.get());
  BIO_up_ref(bio3.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio3.get());

  // Repeating the call does nothing.
  SSL_set_bio(ssl.get(), bio2.get(), bio3.get());

  // It takes one reference when changing only wbio.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio1.get());

  // It takes one reference when changing only rbio and the two are different.
  BIO_up_ref(bio3.get());
  SSL_set_bio(ssl.get(), bio3.get(), bio1.get());

  // If setting wbio to rbio, it takes no additional references.
  SSL_set_bio(ssl.get(), bio3.get(), bio3.get());

  // From there, wbio may be switched to something else.
  BIO_up_ref(bio1.get());
  SSL_set_bio(ssl.get(), bio3.get(), bio1.get());

  // If setting rbio to wbio, it takes no additional references.
  SSL_set_bio(ssl.get(), bio1.get(), bio1.get());

  // From there, rbio may be switched to something else, but, for historical
  // reasons, it takes a reference to both parameters.
  BIO_up_ref(bio1.get());
  BIO_up_ref(bio2.get());
  SSL_set_bio(ssl.get(), bio2.get(), bio1.get());

  // ASAN builds will implicitly test that the internal |BIO| reference-counting
  // is correct.
}